

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  _Rb_tree_node_base *p_Var1;
  Option *pOVar2;
  pointer pcVar3;
  pointer pbVar4;
  Option *this_00;
  pointer ppVar5;
  App *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  bool bVar7;
  INIError *__return_storage_ptr__;
  char *__s;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  pointer ppVar10;
  RequiresError *this_02;
  ExcludesError *this_03;
  long *plVar11;
  ArgumentMismatch *__return_storage_ptr___00;
  RequiredError *pRVar12;
  CallForHelp *this_04;
  ExtrasError *this_05;
  size_type *psVar13;
  long lVar14;
  pointer puVar15;
  Option_p *opt;
  pointer puVar16;
  pointer pbVar17;
  pointer pbVar18;
  bool positional_only;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  bool local_1a1;
  undefined1 local_1a0 [32];
  App *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_178;
  pointer local_170;
  value_type local_168;
  undefined1 local_148 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->parsed_ = true;
  local_1a1 = false;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      _parse_single(this,args,&local_1a1);
    } while ((args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pOVar2 = this->help_ptr_;
  if ((pOVar2 != (Option *)0x0) &&
     ((pOVar2->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pOVar2->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_04 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForHelp::CallForHelp(this_04);
    __cxa_throw(this_04,&CallForHelp::typeinfo,Error::~Error);
  }
  pOVar2 = this->config_ptr_;
  local_180 = this;
  local_178 = args;
  if (pOVar2 != (Option *)0x0) {
    if ((pOVar2->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pOVar2->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      Option::run_callback(pOVar2);
      this->config_required_ = true;
    }
    if ((this->config_name_)._M_string_length != 0) {
      detail::parse_ini((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                        local_1a0,&this->config_name_);
      while (local_1a0._0_8_ != local_1a0._8_8_) {
        bVar7 = _parse_ini(this,(vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                                 *)local_1a0);
        if (!bVar7) {
          __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar3 = (((pointer)(local_1a0._8_8_ + -0x40))->fullname)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,
                     pcVar3 + (((pointer)(local_1a0._8_8_ + -0x40))->fullname)._M_string_length);
          INIError::Extras(__return_storage_ptr__,&local_b0);
          __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,Error::~Error);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                 local_1a0);
    }
  }
  puVar16 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar15) {
    do {
      pOVar2 = (puVar16->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((*(pointer *)
            ((long)&(pOVar2->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8) == *(pointer *)
                     &(pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl) && ((pOVar2->envname_)._M_string_length != 0)) {
        local_1a0._8_8_ = (pointer)0x0;
        local_1a0[0x10] = '\0';
        local_1a0._0_8_ = (pointer)(local_1a0 + 0x10);
        __s = getenv((((puVar16->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->envname_).
                     _M_dataplus._M_p);
        if (__s != (char *)0x0) {
          local_148._0_8_ = (pointer)(local_148 + 0x10);
          sVar8 = strlen(__s);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,__s,__s + sVar8);
          ::std::__cxx11::string::operator=((string *)local_1a0,(string *)local_148);
          if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_);
          }
          if ((pointer)local_1a0._8_8_ != (pointer)0x0) {
            pOVar2 = (puVar16->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_168,local_1a0._0_8_,
                       (pointer)(local_1a0._0_8_ + (long)(string *)local_1a0._8_8_));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&pOVar2->results_,&local_168);
            pOVar2->callback_run_ = false;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p);
            }
          }
        }
        if ((pointer)local_1a0._0_8_ != (pointer)(local_1a0 + 0x10)) {
          operator_delete((void *)local_1a0._0_8_);
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar15);
    puVar16 = (local_180->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (local_180->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar15) {
      do {
        pOVar2 = (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if ((*(pointer *)
              ((long)&(pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8) != (pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) && (pOVar2->callback_run_ == false)
           ) {
          Option::run_callback(pOVar2);
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar15);
      puVar16 = (local_180->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar15 = (local_180->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (puVar16 != puVar15) {
      do {
        local_170 = puVar15;
        pOVar2 = (puVar16->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        bVar7 = (pOVar2->super_OptionBase<CLI::Option>).required_;
        if ((bVar7 != false) ||
           (*(pointer *)
             ((long)&(pOVar2->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8) != *(pointer *)
                      &(pOVar2->results_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl)) {
          if ((pOVar2->expected_ < 0) &&
             ((ulong)((long)*(pointer *)
                             ((long)&(pOVar2->results_).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             + 8) -
                      *(long *)&(pOVar2->results_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl >> 5) < (ulong)(uint)-pOVar2->expected_)) {
            __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
            Option::single_name_abi_cxx11_
                      (&local_50,
                       (puVar16->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            ArgumentMismatch::AtLeast
                      (__return_storage_ptr___00,&local_50,
                       -((puVar16->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->expected_);
            __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
          }
          if ((bVar7 != false) &&
             (*(pointer *)
               ((long)&(pOVar2->results_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               + 8) == *(pointer *)
                        &(pOVar2->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl)) {
            pRVar12 = (RequiredError *)__cxa_allocate_exception(0x38);
            Option::single_name_abi_cxx11_
                      ((string *)local_1a0,
                       (puVar16->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            plVar11 = (long *)::std::__cxx11::string::append(local_1a0);
            local_110._M_dataplus._M_p = (pointer)*plVar11;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)local_110._M_dataplus._M_p == psVar13) {
              local_110.field_2._M_allocated_capacity = *psVar13;
              local_110.field_2._8_8_ = plVar11[3];
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            }
            else {
              local_110.field_2._M_allocated_capacity = *psVar13;
            }
            local_110._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            RequiredError::RequiredError(pRVar12,&local_110);
            __cxa_throw(pRVar12,&RequiredError::typeinfo,Error::~Error);
          }
        }
        p_Var9 = *(_Base_ptr *)((long)&(pOVar2->requires_)._M_t + 0x18);
        p_Var1 = (_Rb_tree_node_base *)((long)&(pOVar2->requires_)._M_t + 8);
        if (p_Var9 != p_Var1) {
          pbVar17 = *(pointer *)
                     &(pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl;
          pbVar4 = *(pointer *)
                    ((long)&(pOVar2->results_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8);
          do {
            if ((pbVar4 != pbVar17) &&
               (this_00 = *(Option **)(p_Var9 + 1),
               (this_00->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               (this_00->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              this_02 = (RequiresError *)__cxa_allocate_exception(0x38);
              Option::single_name_abi_cxx11_
                        (&local_d0,
                         (puVar16->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
              Option::single_name_abi_cxx11_(&local_70,this_00);
              RequiresError::RequiresError(this_02,&local_d0,&local_70);
              __cxa_throw(this_02,&RequiresError::typeinfo,Error::~Error);
            }
            p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != p_Var1);
        }
        p_Var9 = *(_Base_ptr *)((long)&(pOVar2->excludes_)._M_t + 0x18);
        p_Var1 = (_Rb_tree_node_base *)((long)&(pOVar2->excludes_)._M_t + 8);
        if (p_Var9 != p_Var1) {
          pbVar17 = *(pointer *)
                     &(pOVar2->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl;
          pbVar4 = *(pointer *)
                    ((long)&(pOVar2->results_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8);
          do {
            if ((pbVar4 != pbVar17) &&
               (pOVar2 = *(Option **)(p_Var9 + 1),
               (pOVar2->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               (pOVar2->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              this_03 = (ExcludesError *)__cxa_allocate_exception(0x38);
              Option::single_name_abi_cxx11_
                        (&local_f0,
                         (puVar16->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
              Option::single_name_abi_cxx11_(&local_90,pOVar2);
              ExcludesError::ExcludesError(this_03,&local_f0,&local_90);
              __cxa_throw(this_03,&ExcludesError::typeinfo,Error::~Error);
            }
            p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != p_Var1);
        }
        puVar16 = puVar16 + 1;
        puVar15 = local_170;
      } while (puVar16 != local_170);
    }
  }
  this_01 = local_180;
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_1a0,
             &local_180->parsed_subcommands_);
  if ((ulong)((long)(local_1a0._8_8_ - local_1a0._0_8_) >> 3) < this_01->require_subcommand_min_) {
    pRVar12 = (RequiredError *)__cxa_allocate_exception(0x38);
    RequiredError::Subcommand(pRVar12,this_01->require_subcommand_min_);
    __cxa_throw(pRVar12,&RequiredError::typeinfo,Error::~Error);
  }
  if ((this_01->allow_extras_ == false) && (this_01->prefix_command_ == false)) {
    ppVar10 = (this_01->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this_01->missing_).
             super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar10 != ppVar5) {
      lVar14 = 0;
      do {
        lVar14 = lVar14 + (ulong)(ppVar10->first != POSITIONAL_MARK);
        ppVar10 = ppVar10 + 1;
      } while (ppVar10 != ppVar5);
      if (lVar14 != 0) {
        remaining_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148,this_01,false);
        pvVar6 = local_178;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(local_178,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_148);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_148);
        pbVar17 = (pvVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar18 = pbVar4 + -1;
        if (pbVar17 < pbVar18 && pbVar17 != pbVar4) {
          do {
            ::std::__cxx11::string::swap((string *)pbVar17);
            pbVar17 = pbVar17 + 1;
            pbVar18 = pbVar18 + -1;
          } while (pbVar17 < pbVar18);
        }
        this_05 = (ExtrasError *)__cxa_allocate_exception(0x38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_128,local_178);
        ExtrasError::ExtrasError(this_05,&local_128);
        __cxa_throw(this_05,&ExtrasError::typeinfo,Error::~Error);
      }
    }
  }
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_);
  }
  return;
}

Assistant:

void _parse(std::vector<std::string> &args) {
        parsed_ = true;
        bool positional_only = false;

        while(!args.empty()) {
            _parse_single(args, positional_only);
        }

        if(help_ptr_ != nullptr && help_ptr_->count() > 0) {
            throw CallForHelp();
        }

        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<detail::ini_ret_t> values = detail::parse_ini(config_name_);
                    while(!values.empty()) {
                        if(!_parse_ini(values)) {
                            throw INIError::Extras(values.back().fullname);
                        }
                    }
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }

        // Get envname options if not yet passed
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        // Process callbacks
        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        // Verify required options
        for(const Option_p &opt : options_) {
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_expected()))
                    throw ArgumentMismatch::AtLeast(opt->single_name(), -opt->get_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->single_name() + " is required");
            }
            // Requires
            for(const Option *opt_req : opt->requires_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->single_name(), opt_req->single_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->single_name(), opt_ex->single_name());
        }

        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);

        // Convert missing (pairs) to extras (string only)
        if(!(allow_extras_ || prefix_command_)) {
            size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                args = remaining(false);
                std::reverse(std::begin(args), std::end(args));
                throw ExtrasError(args);
            }
        }
    }